

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDSA.cpp
# Opt level: O3

int __thiscall
OSSLECDSA::sign(OSSLECDSA *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen
               )

{
  size_t newSize;
  BIGNUM *pBVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  EC_KEY *eckey;
  undefined8 uVar5;
  long lVar6;
  uchar *puVar7;
  size_t sVar8;
  ECDSA_SIG *sig_00;
  ulong uVar9;
  char *format;
  BIGNUM *bn_r;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  if ((int)tbs == 0x17) {
    cVar2 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLECPrivateKey::type);
    if (cVar2 == '\0') {
      format = "Invalid key type supplied";
      iVar4 = 0x41;
    }
    else {
      eckey = OSSLECPrivateKey::getOSSLKey((OSSLECPrivateKey *)ctx);
      if (eckey == (EC_KEY *)0x0) {
        format = "Could not get the OpenSSL private key";
        iVar4 = 0x4b;
      }
      else {
        uVar5 = EC_KEY_OpenSSL();
        EC_KEY_set_method(eckey,uVar5);
        lVar6 = (**(code **)(*(long *)ctx + 0x40))(ctx);
        if (lVar6 != 0) {
          newSize = lVar6 * 2;
          ByteString::resize((ByteString *)siglen,newSize);
          puVar7 = ByteString::operator[]((ByteString *)siglen,0);
          memset(puVar7,0,newSize);
          puVar7 = ByteString::const_byte_str((ByteString *)sig);
          sVar8 = ByteString::size((ByteString *)sig);
          sig_00 = ECDSA_do_sign(puVar7,(int)sVar8,(EC_KEY *)eckey);
          if (sig_00 != (ECDSA_SIG *)0x0) {
            local_38 = (BIGNUM *)0x0;
            local_40 = (BIGNUM *)0x0;
            ECDSA_SIG_get0(sig_00,&local_38,&local_40);
            pBVar1 = local_38;
            iVar3 = BN_num_bits(local_38);
            iVar4 = iVar3 + 0xe;
            if (-1 < iVar3 + 7) {
              iVar4 = iVar3 + 7;
            }
            puVar7 = ByteString::operator[]((ByteString *)siglen,lVar6 - (iVar4 >> 3));
            BN_bn2bin(pBVar1,puVar7);
            pBVar1 = local_40;
            iVar3 = BN_num_bits(local_40);
            iVar4 = iVar3 + 0xe;
            if (-1 < iVar3 + 7) {
              iVar4 = iVar3 + 7;
            }
            puVar7 = ByteString::operator[]((ByteString *)siglen,newSize - (long)(iVar4 >> 3));
            BN_bn2bin(pBVar1,puVar7);
            ECDSA_SIG_free(sig_00);
            return (int)CONCAT71((int7)((ulong)siglen >> 8),1);
          }
          uVar9 = ERR_get_error();
          softHSMLog(3,"sign",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                     ,0x6c,"ECDSA sign failed (0x%08X)",uVar9);
          return 0;
        }
        format = "Could not get the order length";
        iVar4 = 100;
      }
    }
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
               ,iVar4,format);
  }
  else {
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
               ,0x3a,"Invalid mechanism supplied (%i)",(ulong)tbs & 0xffffffff);
  }
  return 0;
}

Assistant:

bool OSSLECDSA::sign(PrivateKey* privateKey, const ByteString& dataToSign,
		     ByteString& signature, const AsymMech::Type mechanism,
		     const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if (mechanism != AsymMech::ECDSA)
	{
		ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);
		return false;
	}

	// Check if the private key is the right type
	if (!privateKey->isOfType(OSSLECPrivateKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	OSSLECPrivateKey* pk = (OSSLECPrivateKey*) privateKey;
	EC_KEY* eckey = pk->getOSSLKey();

	if (eckey == NULL)
	{
		ERROR_MSG("Could not get the OpenSSL private key");

		return false;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		ECDSA_set_method(eckey, FIPS_ecdsa_openssl());
	else
		ECDSA_set_method(eckey, ECDSA_OpenSSL());
#else
	ECDSA_set_method(eckey, ECDSA_OpenSSL());
#endif

#else
	EC_KEY_set_method(eckey, EC_KEY_OpenSSL());
#endif

	// Perform the signature operation
	size_t len = pk->getOrderLength();
	if (len == 0)
	{
		ERROR_MSG("Could not get the order length");
		return false;
	}
	signature.resize(2 * len);
	memset(&signature[0], 0, 2 * len);
	ECDSA_SIG *sig = ECDSA_do_sign(dataToSign.const_byte_str(), dataToSign.size(), eckey);
	if (sig == NULL)
	{
		ERROR_MSG("ECDSA sign failed (0x%08X)", ERR_get_error());
		return false;
	}
	// Store the 2 values with padding
	const BIGNUM* bn_r = NULL;
	const BIGNUM* bn_s = NULL;
	ECDSA_SIG_get0(sig, &bn_r, &bn_s);
	BN_bn2bin(bn_r, &signature[len - BN_num_bytes(bn_r)]);
	BN_bn2bin(bn_s, &signature[2 * len - BN_num_bytes(bn_s)]);
	ECDSA_SIG_free(sig);
	return true;
}